

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,VoidCastedCallStatementSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  bool bVar1;
  SubroutineKind SVar2;
  CallExpression *pCVar3;
  SourceLocation this;
  ExpressionStatement *pEVar4;
  Statement *pSVar5;
  CallExpression *in_RDX;
  ASTContext *in_RDI;
  ExpressionStatement *result;
  Expression *expr;
  Statement *in_stack_ffffffffffffff48;
  Compilation *in_stack_ffffffffffffff50;
  ASTContext *this_00;
  SourceLocation in_stack_ffffffffffffff78;
  DiagCode in_stack_ffffffffffffff84;
  Diagnostic *this_01;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar6;
  SyntaxNode *in_stack_ffffffffffffffa0;
  bitmask<slang::ast::ASTFlags> local_30;
  SourceLocation local_28;
  CallExpression *local_20;
  ASTContext *local_10;
  ExpressionStatement *local_8;
  undefined4 extraout_var;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  pCVar3 = (CallExpression *)
           not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9ef293);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,TopLevelStatement);
  this._0_4_ = Expression::bind((int)pCVar3,(sockaddr *)local_20,(socklen_t)local_30.m_bits);
  this._4_4_ = extraout_var;
  local_28 = this;
  slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffa0);
  pEVar4 = BumpAllocator::
           emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                     ((BumpAllocator *)this,(Expression *)local_10,(SourceRange *)local_20);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff50);
  if (bVar1) {
    pSVar5 = Statement::badStmt(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    return pSVar5;
  }
  if (*(int *)local_28 == 0x15) {
    Expression::as<slang::ast::CallExpression>((Expression *)local_28);
    SVar2 = CallExpression::getSubroutineKind(pCVar3);
    pCVar3 = local_20;
    this_00 = local_10;
    if (SVar2 == Task) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9ef394)
      ;
      bVar1 = Type::isVoid((Type *)0x9ef39c);
      pCVar3 = local_20;
      this_00 = local_10;
      if (bVar1) goto LAB_009ef3a2;
    }
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9ef414);
    bVar1 = Type::isVoid((Type *)0x9ef41c);
    local_8 = pEVar4;
    if (bVar1) {
      uVar6 = 0x5c0008;
      this_01 = *(Diagnostic **)((long)local_28 + 0x28);
      sourceRange_00.endLoc = in_stack_ffffffffffffff78;
      sourceRange_00.startLoc = this;
      ASTContext::addDiag(this_00,in_stack_ffffffffffffff84,sourceRange_00);
      Expression::as<slang::ast::CallExpression>((Expression *)local_28);
      CallExpression::getSubroutineName(pCVar3);
      arg._M_len._4_4_ = uVar6;
      arg._M_len._0_4_ = in_stack_ffffffffffffff98;
      arg._M_str = (char *)in_stack_ffffffffffffffa0;
      Diagnostic::operator<<(this_01,arg);
    }
  }
  else {
LAB_009ef3a2:
    sourceRange.endLoc = in_stack_ffffffffffffff78;
    sourceRange.startLoc = this;
    ASTContext::addDiag(local_10,in_stack_ffffffffffffff84,sourceRange);
    local_8 = (ExpressionStatement *)
              Statement::badStmt(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const VoidCastedCallStatementSyntax& syntax,
                                           const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.expr, context, ASTFlags::TopLevelStatement);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    if (expr.kind != ExpressionKind::Call ||
        (expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task &&
         expr.type->isVoid())) {
        context.addDiag(diag::VoidCastFuncCall, expr.sourceRange);
        return badStmt(compilation, result);
    }

    if (expr.type->isVoid()) {
        context.addDiag(diag::PointlessVoidCast, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
    }

    return *result;
}